

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.h
# Opt level: O1

void __thiscall lumeview::Shader::add_source(Shader *this,string *filename,GLenum shaderType)

{
  element_type *peVar1;
  iterator iVar2;
  GLuint GVar3;
  ostream *poVar4;
  size_t sVar5;
  LumeviewError *this_00;
  uint shader;
  int success;
  char *shaderSrcCStr;
  string shaderSrc;
  stringstream ss;
  char infoLog [512];
  GLuint local_404;
  GLenum local_400;
  int local_3fc;
  pointer local_3f8;
  string local_3f0;
  string local_3d0;
  stringstream local_3b0 [16];
  ostream local_3a0 [376];
  GLchar local_228 [520];
  
  local_400 = shaderType;
  if (((this->m_shaderData).
       super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_shaderProg == 0) {
    GVar3 = (*glad_glCreateProgram)();
    ((this->m_shaderData).
     super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_shaderProg = GVar3;
  }
  LoadStringFromFile(&local_3f0,filename);
  local_3f8 = local_3f0._M_dataplus._M_p;
  local_404 = (*glad_glCreateShader)(local_400);
  (*glad_glShaderSource)(local_404,1,&local_3f8,(GLint *)0x0);
  (*glad_glCompileShader)(local_404);
  (*glad_glGetShaderiv)(local_404,0x8b81,&local_3fc);
  if (local_3fc != 0) {
    (*glad_glAttachShader)
              (((this->m_shaderData).
                super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_shaderProg,local_404);
    peVar1 = (this->m_shaderData).
             super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1->m_linked = false;
    iVar2._M_current =
         (peVar1->m_shaders).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (peVar1->m_shaders).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&peVar1->m_shaders,iVar2,
                 &local_404);
    }
    else {
      *iVar2._M_current = local_404;
      (peVar1->m_shaders).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&((this->m_shaderData).
                  super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->m_shaderNames,filename);
    peVar1 = (this->m_shaderData).
             super___shared_ptr<lumeview::Shader::ShaderData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2._M_current =
         (peVar1->m_shaderTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (peVar1->m_shaderTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&peVar1->m_shaderTypes,iVar2,
                 &local_400);
    }
    else {
      *iVar2._M_current = local_400;
      (peVar1->m_shaderTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  (*glad_glGetShaderInfoLog)(local_404,0x200,(GLsizei *)0x0,local_228);
  std::__cxx11::stringstream::stringstream(local_3b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_3a0,"SHADER::COMPILATION_FAILED in \'",0x1f);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_3a0,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
  sVar5 = strlen(local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_228,sVar5);
  this_00 = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  LumeviewError::LumeviewError(this_00,&local_3d0);
  __cxa_throw(this_00,&LumeviewError::typeinfo,LumeviewError::~LumeviewError);
}

Assistant:

void add_source (std::string filename, GLenum shaderType) {
		if (!data().m_shaderProg)
			data().m_shaderProg = glCreateProgram ();

	//	load the sources from a file
		std::string shaderSrc = LoadStringFromFile (filename);
		const char* shaderSrcCStr = shaderSrc.c_str();

	//	create the shader object and compile the sources
		uint shader;
		shader = glCreateShader (shaderType);
		glShaderSource (shader, 1, &shaderSrcCStr, NULL);
		glCompileShader (shader);

	//	check for errors
		int success;
		glGetShaderiv (shader, GL_COMPILE_STATUS, &success);
		if (!success) {
			char infoLog[512];
			glGetShaderInfoLog (shader, 512, NULL, infoLog);
			THROW("SHADER::COMPILATION_FAILED in '" << filename << "'\n" << infoLog);
		}

		glAttachShader (data().m_shaderProg, shader);
		data().m_linked = false;
		data().m_shaders.push_back (shader);
		data().m_shaderNames.push_back (filename);
		data().m_shaderTypes.push_back (shaderType);
	}